

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadHuffmanCodeLengths
              (VP8LDecoder *dec,int *code_length_code_lengths,int num_symbols,int *code_lengths)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  uint n_bits;
  long in_RCX;
  long lVar4;
  int in_EDX;
  undefined4 *in_RDI;
  int length;
  int repeat;
  int repeat_offset;
  int extra_bits;
  int slot;
  int use_prev;
  int code_len;
  HuffmanCode *p;
  int length_nbits;
  HuffmanCode table [128];
  int prev_code_len;
  int max_symbol;
  int symbol;
  VP8LBitReader *br;
  int ok;
  uint local_278;
  int local_270;
  int in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  byte local_248 [2];
  ushort auStack_246 [261];
  uint local_3c;
  int local_38;
  int local_34;
  VP8LBitReader *local_30;
  int local_24;
  long local_20;
  int local_14;
  undefined4 *local_8;
  
  local_24 = 0;
  local_30 = (VP8LBitReader *)(in_RDI + 10);
  local_3c = 8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  iVar1 = VP8LBuildHuffmanTable
                    ((HuffmanCode *)table._376_8_,(int)table[0x5d],(int *)table._360_8_,
                     (int)table[0x59]);
  if (iVar1 != 0) {
    uVar2 = VP8LReadBits((VP8LBitReader *)
                         CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                         in_stack_fffffffffffffd94);
    if (uVar2 == 0) {
      local_38 = local_14;
    }
    else {
      VP8LReadBits((VP8LBitReader *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffd94);
      uVar2 = VP8LReadBits((VP8LBitReader *)
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                           in_stack_fffffffffffffd94);
      local_38 = uVar2 + 2;
      if (local_14 < local_38) goto LAB_0011b659;
    }
    local_34 = 0;
    while ((local_34 < local_14 && (local_38 != 0))) {
      local_38 = local_38 + -1;
      VP8LFillBitWindow((VP8LBitReader *)0x11b4e1);
      uVar2 = VP8LPrefetchBits(local_30);
      lVar4 = (ulong)(uVar2 & 0x7f) * 4;
      VP8LSetBitPos(local_30,local_30->bit_pos_ + (uint)local_248[lVar4]);
      uVar3 = (uint)*(ushort *)(local_248 + lVar4 + 2);
      if (uVar3 < 0x10) {
        iVar1 = local_34 + 1;
        *(uint *)(local_20 + (long)local_34 * 4) = uVar3;
        local_34 = iVar1;
        if (uVar3 != 0) {
          local_3c = uVar3;
        }
      }
      else {
        iVar1 = uVar3 - 0x10;
        n_bits = (uint)"\x03\x03\v"[iVar1];
        uVar2 = VP8LReadBits((VP8LBitReader *)CONCAT44(iVar1,(uint)"\x02\x03\a"[iVar1]),n_bits);
        local_270 = uVar2 + n_bits;
        if (local_14 < local_34 + local_270) goto LAB_0011b659;
        if (uVar3 == 0x10) {
          local_278 = local_3c;
        }
        else {
          local_278 = 0;
        }
        while (0 < local_270) {
          *(uint *)(local_20 + (long)local_34 * 4) = local_278;
          local_270 = local_270 + -1;
          local_34 = local_34 + 1;
        }
      }
    }
    local_24 = 1;
  }
LAB_0011b659:
  if (local_24 == 0) {
    *local_8 = 3;
  }
  return local_24;
}

Assistant:

static int ReadHuffmanCodeLengths(
    VP8LDecoder* const dec, const int* const code_length_code_lengths,
    int num_symbols, int* const code_lengths) {
  int ok = 0;
  VP8LBitReader* const br = &dec->br_;
  int symbol;
  int max_symbol;
  int prev_code_len = DEFAULT_CODE_LENGTH;
  HuffmanCode table[1 << LENGTHS_TABLE_BITS];

  if (!VP8LBuildHuffmanTable(table, LENGTHS_TABLE_BITS,
                             code_length_code_lengths,
                             NUM_CODE_LENGTH_CODES)) {
    goto End;
  }

  if (VP8LReadBits(br, 1)) {    // use length
    const int length_nbits = 2 + 2 * VP8LReadBits(br, 3);
    max_symbol = 2 + VP8LReadBits(br, length_nbits);
    if (max_symbol > num_symbols) {
      goto End;
    }
  } else {
    max_symbol = num_symbols;
  }

  symbol = 0;
  while (symbol < num_symbols) {
    const HuffmanCode* p;
    int code_len;
    if (max_symbol-- == 0) break;
    VP8LFillBitWindow(br);
    p = &table[VP8LPrefetchBits(br) & LENGTHS_TABLE_MASK];
    VP8LSetBitPos(br, br->bit_pos_ + p->bits);
    code_len = p->value;
    if (code_len < kCodeLengthLiterals) {
      code_lengths[symbol++] = code_len;
      if (code_len != 0) prev_code_len = code_len;
    } else {
      const int use_prev = (code_len == kCodeLengthRepeatCode);
      const int slot = code_len - kCodeLengthLiterals;
      const int extra_bits = kCodeLengthExtraBits[slot];
      const int repeat_offset = kCodeLengthRepeatOffsets[slot];
      int repeat = VP8LReadBits(br, extra_bits) + repeat_offset;
      if (symbol + repeat > num_symbols) {
        goto End;
      } else {
        const int length = use_prev ? prev_code_len : 0;
        while (repeat-- > 0) code_lengths[symbol++] = length;
      }
    }
  }
  ok = 1;

 End:
  if (!ok) dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  return ok;
}